

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O0

void Abc_NtkRetimeShareLatches(Abc_Ntk_t *pNtk,int fInitial)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pLatchCur;
  Abc_Obj_t *pLatchTop;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vNodes;
  int fInitial_local;
  Abc_Ntk_t *pNtk_local;
  
  vNodes_00 = Vec_PtrAlloc(10);
  local_3c = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_3c) {
      Vec_PtrFree(vNodes_00);
      return;
    }
    pAVar2 = Abc_NtkObj(pNtk,local_3c);
    if ((pAVar2 != (Abc_Obj_t *)0x0) &&
       (iVar1 = Abc_NtkRetimeCheckCompatibleLatchFanouts(pAVar2), 1 < iVar1)) {
      pLatchCur = (Abc_Obj_t *)0x0;
      for (local_40 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_40 < iVar1; local_40 = local_40 + 1
          ) {
        pLatchCur = Abc_ObjFanout(pAVar2,local_40);
        iVar1 = Abc_ObjIsLatch(pLatchCur);
        if (iVar1 != 0) break;
      }
      if ((pLatchCur == (Abc_Obj_t *)0x0) || (iVar1 = Abc_ObjIsLatch(pLatchCur), iVar1 == 0)) {
        __assert_fail("pLatchTop && Abc_ObjIsLatch(pLatchTop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retIncrem.c"
                      ,0x1c4,"void Abc_NtkRetimeShareLatches(Abc_Ntk_t *, int)");
      }
      Abc_NodeCollectFanouts(pAVar2,vNodes_00);
      for (local_40 = 0; iVar1 = Vec_PtrSize(vNodes_00), local_40 < iVar1; local_40 = local_40 + 1)
      {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_40);
        iVar1 = Abc_ObjIsLatch(pAVar2);
        if (((iVar1 != 0) && (pAVar2 != pLatchCur)) &&
           ((pAVar2->field_5).pData == (pLatchCur->field_5).pData)) {
          if (fInitial != 0) {
            Abc_ObjAddFanin((pAVar2->field_6).pCopy,(pLatchCur->field_6).pCopy);
          }
          Abc_ObjTransferFanout(pAVar2,pLatchCur);
          Abc_NtkDeleteObj(pAVar2);
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void Abc_NtkRetimeShareLatches( Abc_Ntk_t * pNtk, int fInitial )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pFanin, * pLatchTop, * pLatchCur;
    int i, k;
    vNodes = Vec_PtrAlloc( 10 );
    // consider latch fanins
    Abc_NtkForEachObj( pNtk, pFanin, i )
    {
        if ( Abc_NtkRetimeCheckCompatibleLatchFanouts(pFanin) <= 1 )
            continue;
        // get the first latch
        pLatchTop = NULL;
        Abc_ObjForEachFanout( pFanin, pLatchTop, k )
            if ( Abc_ObjIsLatch(pLatchTop) )
                break;
        assert( pLatchTop && Abc_ObjIsLatch(pLatchTop) );
        // redirect compatible fanout latches to the first latch
        Abc_NodeCollectFanouts( pFanin, vNodes );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pLatchCur, k )
        {
            if ( !Abc_ObjIsLatch(pLatchCur) )
                continue;
            if ( pLatchCur == pLatchTop )
                continue;
            if ( pLatchCur->pData != pLatchTop->pData )
                continue;
            // connect the initial state
            if ( fInitial )
                Abc_ObjAddFanin( pLatchCur->pCopy, pLatchTop->pCopy );
            // redirect the fanouts
            Abc_ObjTransferFanout( pLatchCur, pLatchTop );
            Abc_NtkDeleteObj(pLatchCur);
        }
    }
    Vec_PtrFree( vNodes );
}